

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ExpressionLhs<bool>::reconstructExpression(ExpressionLhs<bool> *this,string *dest)

{
  bool in_DL;
  string local_30;
  
  Catch::toString_abi_cxx11_(&local_30,(Catch *)(ulong)this->m_truthy,in_DL);
  std::__cxx11::string::operator=((string *)dest,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        dest = Catch::toString( m_truthy );
    }